

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O2

void dereference_suite::run(void)

{
  get_null();
  get_boolean();
  get_integer();
  get_real();
  get_string();
  get_wstring();
  get_u16string();
  get_u32string();
  get_array();
  get_map();
  overwrite_boolean();
  overwrite_integer();
  overwrite_real();
  overwrite_string();
  overwrite_wstring();
  overwrite_u16string();
  overwrite_u32string();
  overwrite_array();
  overwrite_map();
  return;
}

Assistant:

void run()
{
    get_null();
    get_boolean();
    get_integer();
    get_real();
    get_string();
    get_wstring();
    get_u16string();
    get_u32string();
    get_array();
    get_map();

    overwrite_boolean();
    overwrite_integer();
    overwrite_real();
    overwrite_string();
    overwrite_wstring();
    overwrite_u16string();
    overwrite_u32string();
    overwrite_array();
    overwrite_map();
}